

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O3

void __thiscall icu_63::ICUCollatorFactory::~ICUCollatorFactory(ICUCollatorFactory *this)

{
  (this->super_ICUResourceBundleFactory).super_LocaleKeyFactory.super_ICUServiceFactory.
  super_UObject._vptr_UObject = (_func_int **)&PTR__ICUResourceBundleFactory_003ec038;
  UnicodeString::~UnicodeString(&(this->super_ICUResourceBundleFactory)._bundleName);
  LocaleKeyFactory::~LocaleKeyFactory((LocaleKeyFactory *)this);
  return;
}

Assistant:

UObject*
ICUCollatorFactory::create(const ICUServiceKey& key, const ICUService* /* service */, UErrorCode& status) const {
    if (handlesKey(key, status)) {
        const LocaleKey& lkey = (const LocaleKey&)key;
        Locale loc;
        // make sure the requested locale is correct
        // default LocaleFactory uses currentLocale since that's the one vetted by handlesKey
        // but for ICU rb resources we use the actual one since it will fallback again
        lkey.canonicalLocale(loc);
        
        return Collator::makeInstance(loc, status);
    }
    return NULL;
}